

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preEnd__deceleration____common_float_or_param_type
          (ColladaParserAutoGen15Private *this)

{
  ColladaParserAutoGen15Private *this_local;
  
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preEnd__deceleration____common_float_or_param_type()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__deceleration____common_float_or_param_type();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}